

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::uhugeint_t,duckdb::hugeint_t,duckdb::GenericUnaryWrapper,duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>>
               (uhugeint_t *ldata,hugeint_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  ValidityMask *pVVar1;
  ValidityMask *pVVar2;
  ValidityMask *pVVar3;
  int64_t *piVar4;
  hugeint_t hVar5;
  uhugeint_t input;
  uhugeint_t input_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar4 = &result_data->upper;
    pVVar3 = result_mask;
    for (pVVar2 = (ValidityMask *)0x0; (ValidityMask *)count != pVVar2;
        pVVar2 = (ValidityMask *)
                 ((long)&(pVVar2->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)) {
      pVVar1 = pVVar2;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        pVVar1 = (ValidityMask *)(ulong)sel_vector->sel_vector[(long)pVVar2];
      }
      input_00.upper = (uint64_t)result_mask;
      input_00.lower = ldata[(long)pVVar1].upper;
      hVar5 = VectorDecimalCastOperator<duckdb::TryCastToDecimal>::
              Operation<duckdb::uhugeint_t,duckdb::hugeint_t>
                        ((VectorDecimalCastOperator<duckdb::TryCastToDecimal> *)
                         ldata[(long)pVVar1].lower,input_00,pVVar2,(idx_t)dataptr,pVVar3);
      ((hugeint_t *)(piVar4 + -1))->lower = hVar5.lower;
      *piVar4 = hVar5.upper;
      piVar4 = piVar4 + 2;
    }
  }
  else {
    piVar4 = &result_data->upper;
    pVVar3 = result_mask;
    for (pVVar2 = (ValidityMask *)0x0; (ValidityMask *)count != pVVar2;
        pVVar2 = (ValidityMask *)
                 ((long)&(pVVar2->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)) {
      pVVar1 = pVVar2;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        pVVar1 = (ValidityMask *)(ulong)sel_vector->sel_vector[(long)pVVar2];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[(ulong)pVVar1 >> 6] >>
           ((ulong)pVVar1 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,(idx_t)pVVar2);
      }
      else {
        input.upper = (uint64_t)result_mask;
        input.lower = ldata[(long)pVVar1].upper;
        hVar5 = VectorDecimalCastOperator<duckdb::TryCastToDecimal>::
                Operation<duckdb::uhugeint_t,duckdb::hugeint_t>
                          ((VectorDecimalCastOperator<duckdb::TryCastToDecimal> *)
                           ldata[(long)pVVar1].lower,input,pVVar2,(idx_t)dataptr,pVVar3);
        ((hugeint_t *)(piVar4 + -1))->lower = hVar5.lower;
        *piVar4 = hVar5.upper;
      }
      piVar4 = piVar4 + 2;
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}